

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_kv_functional_test.cc
# Opt level: O0

int main(void)

{
  size_t chunksize;
  uint8_t opt;
  int j;
  int i;
  size_t in_stack_000005d8;
  uint8_t in_stack_000005e7;
  size_t in_stack_00000688;
  uint8_t in_stack_00000697;
  size_t in_stack_00000698;
  uint8_t in_stack_000006a7;
  size_t in_stack_000006b8;
  uint8_t in_stack_000006c7;
  size_t in_stack_000007a8;
  uint8_t in_stack_000007b7;
  size_t in_stack_000007b8;
  uint8_t in_stack_000007c7;
  undefined8 local_18;
  int local_c;
  int local_8;
  
  multi_kv_open_test();
  for (local_c = 0; local_c < 3; local_c = local_c + 1) {
    if (local_c == 0) {
      local_18 = 8;
    }
    else if (local_c == 1) {
      local_18 = 0x10;
    }
    else {
      local_18 = 0x20;
    }
    printf("Chunk size: %d bytes\n",local_18);
    for (local_8 = 0; local_8 < 2; local_8 = local_8 + 1) {
      multi_kv_test(in_stack_000007c7,in_stack_000007b8);
      multi_kv_iterator_key_test(in_stack_000006c7,in_stack_000006b8);
      multi_kv_iterator_seq_test(in_stack_000007b7,in_stack_000007a8);
      multi_kv_txn_test(in_stack_00000697,in_stack_00000688);
      multi_kv_snapshot_test(in_stack_000005e7,in_stack_000005d8);
      multi_kv_rollback_test(in_stack_000006a7,in_stack_00000698);
    }
  }
  multi_kv_custom_cmp_test();
  multi_kv_fdb_open_custom_cmp_test();
  multi_kv_use_existing_mode_test();
  multi_kv_close_test();
  return 0;
}

Assistant:

int main(){
    int i, j;
    uint8_t opt;
    size_t chunksize;

    multi_kv_open_test();
    for (j=0;j<3;++j) {
        if (j==0) {
            chunksize = 8;
        } else if (j==1) {
            chunksize = 16;
        } else {
            chunksize = 32;
        }
        printf("Chunk size: %d bytes\n", (int)chunksize);
        for (i=0;i<2;++i){
            opt = (i==0)?(0x0):(MULTI_KV_VAR_CMP);
            multi_kv_test(opt, chunksize);
            multi_kv_iterator_key_test(opt, chunksize);
            multi_kv_iterator_seq_test(opt, chunksize);
            multi_kv_txn_test(opt, chunksize);
            multi_kv_snapshot_test(opt, chunksize);
            multi_kv_rollback_test(opt, chunksize);
        }
    }
    multi_kv_custom_cmp_test();
    multi_kv_fdb_open_custom_cmp_test();
    multi_kv_use_existing_mode_test();
    multi_kv_close_test();

    return 0;
}